

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int rvals [2];
  int lvals [2];
  int local_80 [4];
  Value local_70;
  
  local_80[2] = NumericStats::GetMin<int>(lstats);
  local_80[3] = NumericStats::GetMax<int>(lstats);
  local_80[0] = NumericStats::GetMin<int>(rstats);
  local_80[1] = NumericStats::GetMax<int>(rstats);
  iVar3 = -0x80000000;
  iVar1 = 0x7fffffff;
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      if (0x773593fe < (long)local_80[lVar2] * (long)local_80[uVar5 + 2] + 999999999U)
      goto LAB_015059ec;
      iVar4 = (int)((long)local_80[lVar2] * (long)local_80[uVar5 + 2]);
      if (iVar4 <= iVar1) {
        iVar1 = iVar4;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = iVar4;
    }
  }
  Value::Numeric(&local_70,type,(long)iVar1);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)iVar3);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_015059ec:
  return uVar5 < 2;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}